

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TextFlow::Columns::iterator::iterator
          (iterator *this,
          vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *columns)

{
  pointer *ppiVar1;
  Column *pCVar2;
  iterator __position;
  Column *col;
  Column *pCVar3;
  iterator local_58;
  
  this->m_columns = columns;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_activeIterators = 0;
  std::vector<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,
            ((long)(columns->
                   super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(columns->
                   super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  pCVar2 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->m_columns->
                super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                )._M_impl.super__Vector_impl_data._M_start; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
    local_58.m_pos = (pCVar3->m_string)._M_string_length;
    local_58.m_len = 0;
    local_58.m_end = 0;
    local_58.m_suffix = false;
    __position._M_current =
         (this->m_iterators).
         super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_iterators).
        super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_58.m_column = pCVar3;
      std::
      vector<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
      ::_M_realloc_insert<Catch::TextFlow::Column::iterator>
                (&this->m_iterators,__position,&local_58);
    }
    else {
      *(ulong *)&(__position._M_current)->m_suffix = (ulong)(uint7)local_58._33_7_ << 8;
      (__position._M_current)->m_len = 0;
      (__position._M_current)->m_end = 0;
      (__position._M_current)->m_column = pCVar3;
      (__position._M_current)->m_pos = local_58.m_pos;
      ppiVar1 = &(this->m_iterators).
                 super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + 1;
    }
  }
  return;
}

Assistant:

Columns::iterator::iterator(Columns const &columns, EndTag) :
            m_columns(columns.m_columns), m_activeIterators(0) {

            m_iterators.reserve(m_columns.size());
            for (auto const &col : m_columns) {
                m_iterators.push_back(col.end());
            }
        }